

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitGenericSelectionExpression
          (SyntaxDumper *this,GenericSelectionExpressionSyntax *node)

{
  SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *this_00;
  SyntaxToken SStack_58;
  
  traverseExpression(this,&node->super_ExpressionSyntax);
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->genericKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->commaTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (this_00 = node->assocs_;
      this_00 != (SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *)0x0;
      this_00 = (this_00->
                super_CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                ).
                super_List<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(this_00->
                    super_CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                    ).
                    super_List<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>::delimiterToken(&SStack_58,this_00);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  return Skip;
}

Assistant:

virtual Action visitGenericSelectionExpression(const GenericSelectionExpressionSyntax*  node) override
    {
        traverseExpression(node);
        terminal(node->genericKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->commaToken(), node);
        for (auto it = node->associations(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }